

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-math.cc
# Opt level: O2

void math_sin_cos_pi_test(void)

{
  double dVar1;
  uint cond;
  uint uVar2;
  double dVar3;
  double dVar4;
  double local_38;
  
  dVar1 = tinyusdz::math::cos_pi_imp<double>(1.75);
  dVar4 = tinyusdz::math::sin_pi_imp<double>(1.75);
  dVar3 = dVar1 + dVar4;
  cond = 1;
  if ((dVar3 != 0.0) || (uVar2 = cond, NAN(dVar3))) {
    dVar1 = fmax(ABS(dVar1),ABS(dVar4));
    uVar2 = (uint)(ABS(dVar3) <= dVar1 * 0.0);
  }
  acutest_check_(uVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x36,"%s",
                 "math::is_close(math::cos_pi(315.0/180.0), -math::sin_pi(315.0/180.0), 0.0)");
  dVar1 = tinyusdz::math::cos_pi_imp<double>(1.75);
  dVar4 = tinyusdz::math::sin_pi_imp<double>(1.75);
  acutest_message_("cos(315) = %lf, sin(315) = %lf",SUB84(dVar1,0),SUB84(dVar4,0));
  dVar1 = tinyusdz::math::cos_pi_imp<double>(1.25);
  dVar4 = tinyusdz::math::sin_pi_imp<double>(1.25);
  dVar3 = dVar1 - dVar4;
  if ((dVar3 != 0.0) || (uVar2 = cond, NAN(dVar3))) {
    dVar1 = fmax(ABS(dVar1),ABS(dVar4));
    uVar2 = (uint)(ABS(dVar3) <= dVar1 * 0.0);
  }
  acutest_check_(uVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x39,"%s",
                 "math::is_close(math::cos_pi(225.0/180.0), math::sin_pi(225.0/180.0), 0.0)");
  dVar1 = tinyusdz::math::cos_pi_imp<double>(1.25);
  dVar4 = tinyusdz::math::sin_pi_imp<double>(1.25);
  acutest_message_("cos(225) = %lf, sin(225) = %lf",SUB84(dVar1,0),SUB84(dVar4,0));
  dVar1 = tinyusdz::math::cos_pi_imp<double>(0.75);
  local_38 = -dVar1;
  dVar4 = tinyusdz::math::sin_pi_imp<double>(0.75);
  local_38 = local_38 - dVar4;
  if ((local_38 != 0.0) || (uVar2 = cond, NAN(local_38))) {
    dVar1 = fmax(ABS(dVar1),ABS(dVar4));
    uVar2 = (uint)(ABS(local_38) <= dVar1 * 0.0);
  }
  acutest_check_(uVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x3c,"%s",
                 "math::is_close(-math::cos_pi(135.0/180.0), math::sin_pi(135.0/180.0), 0.0)");
  dVar1 = tinyusdz::math::cos_pi_imp<double>(0.75);
  dVar4 = tinyusdz::math::sin_pi_imp<double>(0.75);
  acutest_message_("cos(135) = %lf, sin(135) = %lf",SUB84(dVar1,0),SUB84(dVar4,0));
  dVar1 = tinyusdz::math::cos_pi_imp<double>(0.25);
  dVar4 = dVar1 + -0.7071067811865476;
  if ((dVar4 != 0.0) || (uVar2 = cond, NAN(dVar4))) {
    dVar1 = ABS(dVar1);
    if (dVar1 <= 0.7071067811865476) {
      dVar1 = 0.7071067811865476;
    }
    uVar2 = (uint)(ABS(dVar4) <= dVar1 * 0.0);
  }
  acutest_check_(uVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x3f,"%s",
                 "math::is_close(math::cos_pi(45.0/180.0), math::sin_pi(45.0/180.0), 0.0)");
  dVar1 = tinyusdz::math::cos_pi_imp<double>(0.25);
  acutest_message_("cos(45) = %lf, sin(45) = %lf",SUB84(dVar1,0),0x667f3bcd);
  dVar1 = tinyusdz::math::cos_pi_imp<double>(-0.25);
  dVar4 = tinyusdz::math::sin_pi_imp<double>(-0.25);
  dVar3 = dVar1 + dVar4;
  if ((dVar3 != 0.0) || (uVar2 = cond, NAN(dVar3))) {
    dVar1 = fmax(ABS(dVar1),ABS(dVar4));
    uVar2 = (uint)(ABS(dVar3) <= dVar1 * 0.0);
  }
  acutest_check_(uVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x42,"%s",
                 "math::is_close(math::cos_pi(-45.0/180.0), -math::sin_pi(-45.0/180.0), 0.0)");
  dVar1 = tinyusdz::math::cos_pi_imp<double>(-0.25);
  dVar4 = tinyusdz::math::sin_pi_imp<double>(-0.25);
  acutest_message_("cos(-45) = %lf, sin(-45) = %lf",SUB84(dVar1,0),SUB84(dVar4,0));
  dVar1 = tinyusdz::math::cos_pi_imp<double>(-0.75);
  dVar4 = tinyusdz::math::sin_pi_imp<double>(-0.75);
  dVar3 = dVar1 - dVar4;
  if ((dVar3 != 0.0) || (uVar2 = cond, NAN(dVar3))) {
    dVar1 = fmax(ABS(dVar1),ABS(dVar4));
    uVar2 = (uint)(ABS(dVar3) <= dVar1 * 0.0);
  }
  acutest_check_(uVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x45,"%s",
                 "math::is_close(math::cos_pi(-135.0/180.0), math::sin_pi(-135.0/180.0), 0.0)");
  dVar1 = tinyusdz::math::cos_pi_imp<double>(-0.75);
  dVar4 = tinyusdz::math::sin_pi_imp<double>(-0.75);
  acutest_message_("cos(-135) = %lf, sin(-135) = %lf",SUB84(dVar1,0),SUB84(dVar4,0));
  dVar1 = tinyusdz::math::cos_pi_imp<double>(-1.25);
  local_38 = -dVar1;
  dVar4 = tinyusdz::math::sin_pi_imp<double>(-1.25);
  local_38 = local_38 - dVar4;
  if ((local_38 != 0.0) || (uVar2 = cond, NAN(local_38))) {
    dVar1 = fmax(ABS(dVar1),ABS(dVar4));
    uVar2 = (uint)(ABS(local_38) <= dVar1 * 0.0);
  }
  acutest_check_(uVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x48,"%s",
                 "math::is_close(-math::cos_pi(-225.0/180.0), math::sin_pi(-225.0/180.0), 0.0)");
  dVar1 = tinyusdz::math::cos_pi_imp<double>(-1.25);
  dVar4 = tinyusdz::math::sin_pi_imp<double>(-1.25);
  acutest_message_("cos(-225) = %lf, sin(-225) = %lf",SUB84(dVar1,0),SUB84(dVar4,0));
  dVar1 = tinyusdz::math::cos_pi_imp<double>(-1.75);
  dVar4 = tinyusdz::math::sin_pi_imp<double>(-1.75);
  dVar3 = dVar1 - dVar4;
  if ((dVar3 != 0.0) || (uVar2 = cond, NAN(dVar3))) {
    dVar1 = fmax(ABS(dVar1),ABS(dVar4));
    uVar2 = (uint)(ABS(dVar3) <= dVar1 * 0.0);
  }
  acutest_check_(uVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x4b,"%s",
                 "math::is_close(math::cos_pi(-315.0/180.0), math::sin_pi(-315.0/180.0), 0.0)");
  dVar1 = tinyusdz::math::cos_pi_imp<double>(-1.75);
  tinyusdz::math::sin_pi_imp<double>(-1.75);
  acutest_message_("cos(-315) = %lf, sin(-315) = %lf",SUB84(dVar1,0));
  dVar1 = tinyusdz::math::cos_pi_imp<double>(0.5);
  if ((dVar1 != 0.0) || (uVar2 = cond, NAN(dVar1))) {
    dVar1 = ABS(dVar1);
    dVar4 = dVar1;
    if (dVar1 <= 0.0) {
      dVar4 = 0.0;
    }
    uVar2 = (uint)(dVar1 <= dVar4 * 0.0);
  }
  acutest_check_(uVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x4f,"%s","math::is_close(math::cos_pi(90.0/180.0), 0.0, 0.0)");
  dVar1 = tinyusdz::math::cos_pi_imp<double>(1.5);
  if ((dVar1 != 0.0) || (uVar2 = cond, NAN(dVar1))) {
    dVar1 = ABS(dVar1);
    dVar4 = dVar1;
    if (dVar1 <= 0.0) {
      dVar4 = 0.0;
    }
    uVar2 = (uint)(dVar1 <= dVar4 * 0.0);
  }
  acutest_check_(uVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x50,"%s","math::is_close(math::cos_pi(270.0/180.0), 0.0, 0.0)");
  dVar1 = tinyusdz::math::cos_pi_imp<double>(-0.5);
  if ((dVar1 != 0.0) || (uVar2 = cond, NAN(dVar1))) {
    dVar1 = ABS(dVar1);
    dVar4 = dVar1;
    if (dVar1 <= 0.0) {
      dVar4 = 0.0;
    }
    uVar2 = (uint)(dVar1 <= dVar4 * 0.0);
  }
  acutest_check_(uVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x51,"%s","math::is_close(math::cos_pi(-90.0/180.0), 0.0, 0.0)");
  dVar1 = tinyusdz::math::cos_pi_imp<double>(-1.5);
  if ((dVar1 != 0.0) || (uVar2 = cond, NAN(dVar1))) {
    dVar1 = ABS(dVar1);
    dVar4 = dVar1;
    if (dVar1 <= 0.0) {
      dVar4 = 0.0;
    }
    uVar2 = (uint)(dVar1 <= dVar4 * 0.0);
  }
  acutest_check_(uVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x52,"%s","math::is_close(math::cos_pi(-270.0/180.0), 0.0, 0.0)");
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x53,"%s","math::is_close(math::sin_pi(0.0), 0.0, 0.0)");
  dVar1 = tinyusdz::math::sin_pi_imp<double>(2.0);
  if ((dVar1 != 0.0) || (uVar2 = cond, NAN(dVar1))) {
    dVar1 = ABS(dVar1);
    dVar4 = dVar1;
    if (dVar1 <= 0.0) {
      dVar4 = 0.0;
    }
    uVar2 = (uint)(dVar1 <= dVar4 * 0.0);
  }
  acutest_check_(uVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x54,"%s","math::is_close(math::sin_pi(360.0/180.0), 0.0, 0.0)");
  dVar1 = tinyusdz::math::sin_pi_imp<double>(1.0);
  if ((dVar1 != 0.0) || (uVar2 = cond, NAN(dVar1))) {
    dVar1 = ABS(dVar1);
    dVar4 = dVar1;
    if (dVar1 <= 0.0) {
      dVar4 = 0.0;
    }
    uVar2 = (uint)(dVar1 <= dVar4 * 0.0);
  }
  acutest_check_(uVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x55,"%s","math::is_close(math::sin_pi(180.0/180.0), 0.0, 0.0)");
  dVar1 = tinyusdz::math::sin_pi_imp<double>(-1.0);
  if ((dVar1 != 0.0) || (uVar2 = cond, NAN(dVar1))) {
    dVar1 = ABS(dVar1);
    dVar4 = dVar1;
    if (dVar1 <= 0.0) {
      dVar4 = 0.0;
    }
    uVar2 = (uint)(dVar1 <= dVar4 * 0.0);
  }
  acutest_check_(uVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x56,"%s","math::is_close(math::sin_pi(-180.0/180.0), 0.0, 0.0)");
  dVar1 = tinyusdz::math::sin_pi_imp<double>(-2.0);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar1 = ABS(dVar1);
    dVar4 = dVar1;
    if (dVar1 <= 0.0) {
      dVar4 = 0.0;
    }
    cond = (uint)(dVar1 <= dVar4 * 0.0);
  }
  acutest_check_(cond,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x57,"%s","math::is_close(math::sin_pi(-360.0/180.0), 0.0, 0.0)");
  return;
}

Assistant:

void math_sin_cos_pi_test(void) {

  // should exactly match(whereas std::sin/cos is not)
  TEST_CHECK(math::is_close(math::cos_pi(315.0/180.0), -math::sin_pi(315.0/180.0), 0.0));
  TEST_MSG("cos(315) = %lf, sin(315) = %lf", math::cos_pi(315.0/180.0), math::sin_pi(315.0/180.0));

  TEST_CHECK(math::is_close(math::cos_pi(225.0/180.0), math::sin_pi(225.0/180.0), 0.0));
  TEST_MSG("cos(225) = %lf, sin(225) = %lf", math::cos_pi(225.0/180.0), math::sin_pi(225.0/180.0));

  TEST_CHECK(math::is_close(-math::cos_pi(135.0/180.0), math::sin_pi(135.0/180.0), 0.0));
  TEST_MSG("cos(135) = %lf, sin(135) = %lf", math::cos_pi(135.0/180.0), math::sin_pi(135.0/180.0));

  TEST_CHECK(math::is_close(math::cos_pi(45.0/180.0), math::sin_pi(45.0/180.0), 0.0));
  TEST_MSG("cos(45) = %lf, sin(45) = %lf", math::cos_pi(45.0/180.0), math::sin_pi(45.0/180.0));

  TEST_CHECK(math::is_close(math::cos_pi(-45.0/180.0), -math::sin_pi(-45.0/180.0), 0.0));
  TEST_MSG("cos(-45) = %lf, sin(-45) = %lf", math::cos_pi(-45.0/180.0), math::sin_pi(-45.0/180.0));

  TEST_CHECK(math::is_close(math::cos_pi(-135.0/180.0), math::sin_pi(-135.0/180.0), 0.0));
  TEST_MSG("cos(-135) = %lf, sin(-135) = %lf", math::cos_pi(-135.0/180.0), math::sin_pi(-135.0/180.0));

  TEST_CHECK(math::is_close(-math::cos_pi(-225.0/180.0), math::sin_pi(-225.0/180.0), 0.0));
  TEST_MSG("cos(-225) = %lf, sin(-225) = %lf", math::cos_pi(-225.0/180.0), math::sin_pi(-225.0/180.0));

  TEST_CHECK(math::is_close(math::cos_pi(-315.0/180.0), math::sin_pi(-315.0/180.0), 0.0));
  TEST_MSG("cos(-315) = %lf, sin(-315) = %lf", math::cos_pi(-315.0/180.0), math::sin_pi(-315.0/180.0));

  // must be exactly zero
  TEST_CHECK(math::is_close(math::cos_pi(90.0/180.0), 0.0, 0.0));
  TEST_CHECK(math::is_close(math::cos_pi(270.0/180.0), 0.0, 0.0));
  TEST_CHECK(math::is_close(math::cos_pi(-90.0/180.0), 0.0, 0.0));
  TEST_CHECK(math::is_close(math::cos_pi(-270.0/180.0), 0.0, 0.0));
  TEST_CHECK(math::is_close(math::sin_pi(0.0), 0.0, 0.0));
  TEST_CHECK(math::is_close(math::sin_pi(360.0/180.0), 0.0, 0.0));
  TEST_CHECK(math::is_close(math::sin_pi(180.0/180.0), 0.0, 0.0));
  TEST_CHECK(math::is_close(math::sin_pi(-180.0/180.0), 0.0, 0.0));
  TEST_CHECK(math::is_close(math::sin_pi(-360.0/180.0), 0.0, 0.0));
}